

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

wchar_t wc_to_mb(wchar_t codepage,wchar_t flags,wchar_t *wcstr,wchar_t wclen,char *mbstr,
                wchar_t mblen,char *defchr)

{
  size_t __n;
  char *local_80;
  wchar_t local_64;
  wchar_t n_1;
  size_t i;
  wchar_t n;
  mbstate_t state;
  char output [16];
  wchar_t mblen_local;
  char *mbstr_local;
  wchar_t *pwStack_20;
  wchar_t wclen_local;
  wchar_t *wcstr_local;
  wchar_t local_10;
  wchar_t flags_local;
  wchar_t codepage_local;
  
  mbstr_local._4_4_ = wclen;
  pwStack_20 = wcstr;
  wcstr_local._4_4_ = flags;
  local_10 = codepage;
  if (codepage == L'\xffff') {
    i._4_4_ = L'\0';
    memset(&stack0xffffffffffffffb0,0,8);
    for (; ((L'\0' < mbstr_local._4_4_ &&
            (__n = wcrtomb((char *)&state,*pwStack_20,(mbstate_t *)&stack0xffffffffffffffb0),
            __n != 0xffffffffffffffff)) && (__n <= (ulong)(long)(i._4_4_ - mblen)));
        i._4_4_ = i._4_4_ + (int)__n) {
      memcpy(mbstr + i._4_4_,&state,__n);
      pwStack_20 = pwStack_20 + 1;
      mbstr_local._4_4_ = mbstr_local._4_4_ + L'\xffffffff';
    }
    flags_local = i._4_4_;
  }
  else if (codepage == L'\0') {
    local_64 = L'\0';
    for (; L'\0' < mbstr_local._4_4_ && local_64 < mblen;
        mbstr_local._4_4_ = mbstr_local._4_4_ + L'\xffffffff') {
      if ((*pwStack_20 < L'\xd800') || (L'\xd8ff' < *pwStack_20)) {
        if (defchr != (char *)0x0) {
          mbstr[local_64] = *defchr;
          local_64 = local_64 + L'\x01';
        }
      }
      else {
        mbstr[local_64] = (char)*pwStack_20;
        local_64 = local_64 + L'\x01';
      }
      pwStack_20 = pwStack_20 + 1;
    }
    flags_local = local_64;
  }
  else {
    if (defchr == (char *)0x0) {
      local_80 = (char *)0x0;
    }
    else {
      local_80 = defchr;
    }
    flags_local = charset_from_unicode
                            (&stack0xffffffffffffffe0,(wchar_t *)((long)&mbstr_local + 4),mbstr,
                             mblen,codepage,(charset_state *)0x0,local_80,
                             (uint)(defchr != (char *)0x0));
  }
  return flags_local;
}

Assistant:

int wc_to_mb(int codepage, int flags, const wchar_t *wcstr, int wclen,
             char *mbstr, int mblen, const char *defchr)
{
    if (codepage == DEFAULT_CODEPAGE) {
        char output[MB_LEN_MAX];
        mbstate_t state;
        int n = 0;

        memset(&state, 0, sizeof state);

        while (wclen > 0) {
            size_t i = wcrtomb(output, wcstr[0], &state);
            if (i == (size_t)-1 || i > n - mblen)
                break;
            memcpy(mbstr+n, output, i);
            n += i;
            wcstr++;
            wclen--;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;
        while (wclen > 0 && n < mblen) {
            if (*wcstr >= 0xD800 && *wcstr < 0xD900)
                mbstr[n++] = (*wcstr & 0xFF);
            else if (defchr)
                mbstr[n++] = *defchr;
            wcstr++;
            wclen--;
        }
        return n;
    } else {
        return charset_from_unicode(&wcstr, &wclen, mbstr, mblen, codepage,
                                    NULL, defchr?defchr:NULL, defchr?1:0);
    }
}